

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O0

int blake2b_init_param(blake2b_state *S,blake2b_param *P)

{
  uint64_t uVar1;
  long in_RSI;
  long in_RDI;
  uint8_t *p;
  size_t i;
  blake2b_state *in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  blake2b_init0(in_stack_ffffffffffffffe0);
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    uVar1 = load64((void *)(in_RSI + local_18 * 8));
    *(uint64_t *)(in_RDI + local_18 * 8) = uVar1 ^ *(ulong *)(in_RDI + local_18 * 8);
  }
  return 0;
}

Assistant:

int blake2b_init_param( blake2b_state *S, const blake2b_param *P )
{
    size_t i;
    uint8_t *p;

  blake2b_init0( S );
    p = ( uint8_t * )( P );

  /* IV XOR ParamBlock */
  for( i = 0; i < 8; ++i )
    S->h[i] ^= load64( p + sizeof( S->h[i] ) * i );

  return 0;
}